

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzer.cpp
# Opt level: O3

void __thiscall
PS2KeyboardAnalyzer::GetNextData
          (PS2KeyboardAnalyzer *this,U64 *starting_frame,U64 *ending_frame,bool *DeviceToHost,
          U64 *Payload,bool *ParityError,bool *ACKed)

{
  AnalyzerChannelData *pAVar1;
  PS2KeyboardAnalyzerResults *pPVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  MarkerType MVar6;
  uint uVar7;
  U64 UVar8;
  U64 data;
  DataBuilder local_50 [8];
  U64 local_48;
  U64 *local_40;
  bool *local_38;
  
  local_40 = ending_frame;
  local_38 = ParityError;
  do {
    iVar5 = AnalyzerChannelData::GetBitState();
    if (iVar5 == 0) {
      pAVar1 = this->mData;
      AnalyzerChannelData::GetSampleOfNextEdge();
      cVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
      if ((cVar3 == '\0') || (iVar5 = AnalyzerChannelData::GetBitState(), iVar5 != 1))
      goto LAB_00105f15;
LAB_00105f9e:
      bVar4 = false;
    }
    else {
LAB_00105f15:
      while ((iVar5 = AnalyzerChannelData::GetBitState(), iVar5 == 1 &&
             (iVar5 = AnalyzerChannelData::GetBitState(), iVar5 == 1))) {
        AnalyzerChannelData::GetSampleOfNextEdge();
        AnalyzerChannelData::GetSampleOfNextEdge();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
      }
      iVar5 = AnalyzerChannelData::GetBitState();
      if (iVar5 == 0) {
        pAVar1 = this->mData;
        AnalyzerChannelData::GetSampleOfNextEdge();
        cVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
        if ((cVar3 != '\0') && (iVar5 = AnalyzerChannelData::GetBitState(), iVar5 == 1))
        goto LAB_00105f9e;
      }
      bVar4 = true;
    }
    *DeviceToHost = bVar4;
    AnalyzerChannelData::AdvanceToNextEdge();
    pAVar1 = this->mData;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    UVar8 = AnalyzerChannelData::GetSampleNumber();
    *starting_frame = UVar8;
    iVar5 = AnalyzerChannelData::GetBitState();
  } while (iVar5 != 0);
  iVar5 = 8;
  AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,(MarkerType)UVar8,(Channel *)0x8);
  AnalyzerResults::AddMarker
            ((ulonglong)(this->mResults)._M_ptr,(MarkerType)UVar8,
             (Channel *)(ulong)(*DeviceToHost | 4));
  local_48 = 0;
  DataBuilder::DataBuilder(local_50);
  DataBuilder::Reset((ulonglong *)local_50,(ShiftOrder)&local_48,1);
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    AnalyzerChannelData::AdvanceToNextEdge();
    MVar6 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)(ulong)(*DeviceToHost | 4));
    AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)0x0);
    AnalyzerChannelData::GetBitState();
    DataBuilder::AddBit((BitState)local_50);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  *Payload = local_48;
  AnalyzerChannelData::AdvanceToNextEdge();
  AnalyzerChannelData::AdvanceToNextEdge();
  MVar6 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddMarker
            ((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)(ulong)(*DeviceToHost | 4));
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
  iVar5 = AnalyzerChannelData::GetBitState();
  uVar7 = AnalyzerHelpers::GetOnesCount(local_48);
  cVar3 = AnalyzerHelpers::IsOdd((ulong)uVar7);
  pPVar2 = (this->mResults)._M_ptr;
  if (cVar3 == '\0') {
    if (iVar5 == 1) goto LAB_0010615d;
  }
  else if (iVar5 == 0) {
LAB_0010615d:
    AnalyzerResults::AddMarker((ulonglong)pPVar2,MVar6,(Channel *)0x2);
    bVar4 = false;
    goto LAB_0010616c;
  }
  bVar4 = true;
  AnalyzerResults::AddMarker((ulonglong)pPVar2,MVar6,(Channel *)0x7);
LAB_0010616c:
  *local_38 = bVar4;
  AnalyzerChannelData::AdvanceToNextEdge();
  AnalyzerChannelData::AdvanceToNextEdge();
  MVar6 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
  AnalyzerResults::AddMarker
            ((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)(ulong)(*DeviceToHost | 4));
  iVar5 = AnalyzerChannelData::GetBitState();
  AnalyzerResults::AddMarker
            ((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)(ulong)((uint)(iVar5 == 1) * 2 + 7)
            );
  if (*DeviceToHost == false) {
    AnalyzerChannelData::AdvanceToNextEdge();
    AnalyzerChannelData::AdvanceToNextEdge();
    MVar6 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
    AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,MVar6,(Channel *)0x4);
    iVar5 = AnalyzerChannelData::GetBitState();
    *ACKed = iVar5 == 1;
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,MVar6,
               (Channel *)(ulong)((uint)(iVar5 == 1) * 5 + 2));
    AnalyzerChannelData::AdvanceToNextEdge();
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
  }
  UVar8 = AnalyzerChannelData::GetSampleNumber();
  *local_40 = UVar8;
  DataBuilder::~DataBuilder(local_50);
  return;
}

Assistant:

void PS2KeyboardAnalyzer::GetNextData( U64& starting_frame, U64& ending_frame, bool& DeviceToHost, U64& Payload, bool& ParityError,
                                       bool& ACKed )
{
    // Function built by looking at waveforms located here: http://retired.beyondlogic.org/keyboard/keybrd.htm
    // Note that there is conflicting information on the internet concerning the most popular websites for this protocol
    // some indicate that data is always sampled on falling clock edges, others indicate host to device communication
    // should be read on rising edges. Experimentation with Sony PS/2 PC and keyboard indicate host-to-device must be
    // read on rising clock edges, confirming some of the sources I found on the internet

    // if theres a transition in data before the clock goes high, request to send
    bool gotdata = false;
    while( !gotdata )
    {
        if( mClock->GetBitState() == BIT_LOW && mData->WouldAdvancingToAbsPositionCauseTransition( mClock->GetSampleOfNextEdge() ) &&
            mData->GetBitState() == BIT_HIGH )
            DeviceToHost = false;
        else
        {
            // advance until there is some activity on the channels
            while( mClock->GetBitState() == BIT_HIGH && mData->GetBitState() == BIT_HIGH )
            {
                U64 NextEdgeData = mData->GetSampleOfNextEdge();
                U64 NextEdgeClock = mClock->GetSampleOfNextEdge();

                if( NextEdgeData < NextEdgeClock )
                {
                    mClock->AdvanceToAbsPosition( NextEdgeData );
                    mData->AdvanceToAbsPosition( NextEdgeData );
                }
                else
                {
                    mClock->AdvanceToAbsPosition( NextEdgeClock );
                    mData->AdvanceToAbsPosition( NextEdgeClock );
                }
            }

            // if the first activity is a Request-To-Send, then the transmission will be from Host to Device
            if( mClock->GetBitState() == BIT_LOW && mData->WouldAdvancingToAbsPositionCauseTransition( mClock->GetSampleOfNextEdge() ) &&
                mData->GetBitState() == BIT_HIGH )
                DeviceToHost = false;
            else
                DeviceToHost = true;
        }

        // now we know direction, lets start getting the data
        mClock->AdvanceToNextEdge();
        mData->AdvanceToAbsPosition( mClock->GetSampleNumber() );

        // Now we are at the start bit of a transmission
        U64 current_location = mClock->GetSampleNumber();
        starting_frame = current_location;

        // the start bit is always 0, make sure this is zero, otherwise mark it as an error
        if( mData->GetBitState() == BIT_LOW )
        {
            // valid start bit, mark edge of clock and mark start bit with green circle
            mResults->AddMarker( current_location, AnalyzerResults::Start, mSettings->mDataChannel );

            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

            // prepare to collect the data
            U64 data = 0;
            DataBuilder data_builder;
            data_builder.Reset( &data, AnalyzerEnums::LsbFirst, 8 );

            // loop through the 8 bits of payload
            for( U32 i = 0; i < 8; i++ )
            {
                // advance to the payload bits beginning at the next falling edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();

                mData->AdvanceToAbsPosition( current_location );

                // mark the clock edge

                if( DeviceToHost )
                    mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
                else
                    mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

                // mark the data channel
                mResults->AddMarker( current_location, AnalyzerResults::Dot, mSettings->mDataChannel );

                // read the value of the bit
                data_builder.AddBit( mData->GetBitState() );
            }

            // set Payload = data for return variable
            Payload = data;

            // advance to the parity bit
            mClock->AdvanceToNextEdge();
            mClock->AdvanceToNextEdge();
            current_location = mClock->GetSampleNumber();

            // mark the clock edge
            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );
            mData->AdvanceToAbsPosition( current_location );

            // read the parity bit from the stream and compare
            int received_parity;
            received_parity = mData->GetBitState();

            // now get expected value of parity bit
            if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( data ) ) )
            {
                if( received_parity == BIT_LOW )
                {
                    // parity is correct
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                    ParityError = false;
                }
                else
                {
                    // parity is incorrect
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                    ParityError = true;
                }
            }
            else
            {
                if( received_parity == BIT_HIGH )
                {
                    // parity is correct
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                    ParityError = false;
                }
                else
                {
                    // parity is incorrect
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                    ParityError = true;
                }
            }

            // advance to the stop bit
            mClock->AdvanceToNextEdge();
            mClock->AdvanceToNextEdge();
            current_location = mClock->GetSampleNumber();
            mData->AdvanceToAbsPosition( current_location );

            // mark the clock edge
            if( DeviceToHost )
                mResults->AddMarker( current_location, AnalyzerResults::DownArrow, mSettings->mClockChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

            // make sure the stop bit is 1
            if( mData->GetBitState() == BIT_HIGH )
                mResults->AddMarker( current_location, AnalyzerResults::Stop, mSettings->mDataChannel );
            else
                mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );


            // if the transmit direction is host to device, check for the ACK
            if( !DeviceToHost )
            {
                // check for ACK from Device, read on falling edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();
                mData->AdvanceToAbsPosition( current_location );

                // mark the clock edge
                mResults->AddMarker( current_location, AnalyzerResults::UpArrow, mSettings->mClockChannel );

                // Ack should be 0, otherwise error
                if( mData->GetBitState() == BIT_HIGH )
                {
                    ACKed = true;
                    mResults->AddMarker( current_location, AnalyzerResults::ErrorX, mSettings->mDataChannel );
                }
                else
                {
                    ACKed = false;
                    mResults->AddMarker( current_location, AnalyzerResults::Square, mSettings->mDataChannel );
                }

                // since ACK is read on falling cycle, we need to advance to the edge of this pulse
                mClock->AdvanceToNextEdge();
                current_location = mClock->GetSampleNumber();
                mData->AdvanceToAbsPosition( current_location );
            }

            // all done, the tranmission ended here
            ending_frame = mClock->GetSampleNumber();
            gotdata = true;
        }
        else
        {
            gotdata = false;
        }
    }
}